

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O3

uint32_t sym_GetPCValue(void)

{
  uint32_t uVar1;
  Section *pSVar2;
  char *fmt;
  
  pSVar2 = sect_GetSymbolSection();
  if (pSVar2 == (Section *)0x0) {
    fmt = "PC has no value outside a section\n";
  }
  else {
    if (pSVar2->org != 0xffffffff) {
      uVar1 = CallbackPC();
      return uVar1;
    }
    fmt = "Expected constant PC but section is not fixed\n";
  }
  error(fmt);
  return 0;
}

Assistant:

uint32_t sym_GetPCValue(void)
{
	struct Section const *sect = sect_GetSymbolSection();

	if (!sect)
		error("PC has no value outside a section\n");
	else if (sect->org == (uint32_t)-1)
		error("Expected constant PC but section is not fixed\n");
	else
		return CallbackPC();
	return 0;
}